

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

void Sfm_DecCreateCnf(Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,Vec_Wec_t *vGateCnfs)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Str_t *vCnf;
  char *pcVar3;
  Vec_Int_t *vCover;
  int *piVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  
  vCnf = (Vec_Str_t *)malloc(0x10);
  vCnf->nCap = 100;
  vCnf->nSize = 0;
  pcVar3 = (char *)malloc(100);
  vCnf->pArray = pcVar3;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 100;
  vCover->nSize = 0;
  piVar4 = (int *)malloc(400);
  vCover->pArray = piVar4;
  if (0 < vGateFuncs->nSize) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      if (vGateSizes->nSize <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Sfm_TruthToCnf(vGateFuncs->pArray[lVar7],vGateSizes->pArray[lVar7],vCover,vCnf);
      if (vGateCnfs->nSize <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar2 = vGateCnfs->pArray;
      iVar1 = vCnf->nSize;
      if (*(int *)((long)pVVar2 + lVar6 + -8) < iVar1) {
        pvVar5 = *(void **)((long)&pVVar2->nCap + lVar6);
        if (pvVar5 == (void *)0x0) {
          pvVar5 = malloc((long)iVar1);
        }
        else {
          pvVar5 = realloc(pvVar5,(long)iVar1);
        }
        *(void **)((long)&pVVar2->nCap + lVar6) = pvVar5;
        *(int *)((long)pVVar2 + lVar6 + -8) = iVar1;
      }
      memcpy(*(void **)((long)&pVVar2->nCap + lVar6),vCnf->pArray,(long)vCnf->nSize);
      *(int *)((long)pVVar2 + lVar6 + -4) = vCnf->nSize;
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < vGateFuncs->nSize);
  }
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  if (vCnf->pArray != (char *)0x0) {
    free(vCnf->pArray);
    vCnf->pArray = (char *)0x0;
  }
  free(vCnf);
  return;
}

Assistant:

void Sfm_DecCreateCnf( Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs )
{
    Vec_Str_t * vCnf, * vCnfBase;
    Vec_Int_t * vCover;
    word uTruth;
    int i, nCubes;
    vCnf = Vec_StrAlloc( 100 );
    vCover = Vec_IntAlloc( 100 );
    Vec_WrdForEachEntry( vGateFuncs, uTruth, i )
    {
        nCubes = Sfm_TruthToCnf( uTruth, Vec_IntEntry(vGateSizes, i), vCover, vCnf );
        vCnfBase = (Vec_Str_t *)Vec_WecEntry( vGateCnfs, i );
        Vec_StrGrow( vCnfBase, Vec_StrSize(vCnf) );
        memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(vCnf), Vec_StrSize(vCnf) );
        vCnfBase->nSize = Vec_StrSize(vCnf);
    }
    Vec_IntFree( vCover );
    Vec_StrFree( vCnf );
}